

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq.c
# Opt level: O2

int nn_xreq_send_to(nn_sockbase *self,nn_msg *msg,nn_pipe **to)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  char *pcVar3;
  
  iVar1 = nn_lb_send((nn_lb *)(self + 1),msg,to);
  if (iVar1 == -0xb) {
    iVar2 = -0xb;
  }
  else {
    iVar2 = 0;
    if (iVar1 < 0) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar3 = nn_err_strerror(-iVar1);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)(uint)-iVar1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/xreq.c"
              ,0xad);
      fflush(_stderr);
      nn_err_abort();
    }
  }
  return iVar2;
}

Assistant:

int nn_xreq_send_to (struct nn_sockbase *self, struct nn_msg *msg,
    struct nn_pipe **to)
{
    int rc;

    /*  If request cannot be sent due to the pushback, drop it silenly. */
    rc = nn_lb_send (&nn_cont (self, struct nn_xreq, sockbase)->lb, msg, to);
    if (nn_slow (rc == -EAGAIN))
        return -EAGAIN;
    errnum_assert (rc >= 0, -rc);

    return 0;
}